

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O1

void __thiscall sf::RenderTarget::resetGLStates(RenderTarget *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  socklen_t __len;
  socklen_t __len_00;
  socklen_t extraout_EDX;
  socklen_t __len_01;
  sockaddr *__addr;
  
  bVar1 = Shader::isAvailable();
  bVar2 = VertexBuffer::isAvailable();
  bVar3 = anon_unknown.dwarf_35c620::RenderTargetImpl::isActive(this->m_id);
  if ((!bVar3) && (iVar4 = (*this->_vptr_RenderTarget[4])(this,1), (char)iVar4 == '\0')) {
    return;
  }
  priv::ensureExtensionsInit();
  if (SF_GLAD_GL_ARB_multitexture != 0) {
    (*sf_glad_glClientActiveTextureARB)(0x84c0);
    (*sf_glad_glActiveTextureARB)(0x84c0);
  }
  (*sf_glad_glDisable)(0xb44);
  (*sf_glad_glDisable)(0xb50);
  (*sf_glad_glDisable)(0xb71);
  (*sf_glad_glDisable)(0xbc0);
  (*sf_glad_glEnable)(0xde1);
  (*sf_glad_glEnable)(0xbe2);
  (*sf_glad_glMatrixMode)(0x1700);
  (*sf_glad_glLoadIdentity)();
  (*sf_glad_glEnableClientState)(0x8074);
  (*sf_glad_glEnableClientState)(0x8076);
  (*sf_glad_glEnableClientState)(0x8078);
  (this->m_cache).glStatesSet = true;
  applyBlendMode(this,(BlendMode *)BlendAlpha);
  __addr = (sockaddr *)0x1;
  Texture::bind(0,(sockaddr *)0x1,__len);
  (this->m_cache).lastTextureId = 0;
  __len_01 = __len_00;
  if (bVar1) {
    Shader::bind(0,__addr,__len_00);
    __len_01 = extraout_EDX;
  }
  if (bVar2) {
    VertexBuffer::bind(0,__addr,__len_01);
  }
  (this->m_cache).texCoordsArrayEnabled = true;
  (this->m_cache).useVertexCache = false;
  (this->m_cache).viewChanged = true;
  (this->m_cache).enable = true;
  return;
}

Assistant:

void RenderTarget::resetGLStates()
{
    // Check here to make sure a context change does not happen after activate(true)
    bool shaderAvailable = Shader::isAvailable();
    bool vertexBufferAvailable = VertexBuffer::isAvailable();

    // Workaround for states not being properly reset on
    // macOS unless a context switch really takes place
    #if defined(SFML_SYSTEM_MACOS)
        setActive(false);
    #endif

    if (RenderTargetImpl::isActive(m_id) || setActive(true))
    {
        // Make sure that extensions are initialized
        priv::ensureExtensionsInit();

        // Make sure that the texture unit which is active is the number 0
        if (GLEXT_multitexture)
        {
            glCheck(GLEXT_glClientActiveTexture(GLEXT_GL_TEXTURE0));
            glCheck(GLEXT_glActiveTexture(GLEXT_GL_TEXTURE0));
        }

        // Define the default OpenGL states
        glCheck(glDisable(GL_CULL_FACE));
        glCheck(glDisable(GL_LIGHTING));
        glCheck(glDisable(GL_DEPTH_TEST));
        glCheck(glDisable(GL_ALPHA_TEST));
        glCheck(glEnable(GL_TEXTURE_2D));
        glCheck(glEnable(GL_BLEND));
        glCheck(glMatrixMode(GL_MODELVIEW));
        glCheck(glLoadIdentity());
        glCheck(glEnableClientState(GL_VERTEX_ARRAY));
        glCheck(glEnableClientState(GL_COLOR_ARRAY));
        glCheck(glEnableClientState(GL_TEXTURE_COORD_ARRAY));
        m_cache.glStatesSet = true;

        // Apply the default SFML states
        applyBlendMode(BlendAlpha);
        applyTexture(NULL);
        if (shaderAvailable)
            applyShader(NULL);

        if (vertexBufferAvailable)
            glCheck(VertexBuffer::bind(NULL));

        m_cache.texCoordsArrayEnabled = true;

        m_cache.useVertexCache = false;

        // Set the default view
        setView(getView());

        m_cache.enable = true;
    }
}